

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLOptions::DefineParams(CLOptions *this)

{
  vector<option,_std::allocator<option>_> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *this_01;
  _Base_ptr p_Var1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  pointer name;
  pointer ppVar10;
  pointer name_00;
  pointer ppVar11;
  pointer name_01;
  pointer ppVar12;
  pointer name_02;
  pointer ppVar13;
  ulong uVar14;
  size_type __n;
  ulong uVar15;
  CLOptions *pCVar16;
  CLOptions *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *this_03;
  iterator siter;
  iterator iiter;
  iterator diter;
  iterator biter;
  allocator local_b9;
  undefined1 local_b8 [32];
  CLOptions *local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  local_60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  local_58;
  string local_50;
  
  this_00 = &this->longopts;
  std::vector<option,_std::allocator<option>_>::clear(this_00);
  local_78 = (_Base_ptr)&this->params_bools;
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                  *)local_78);
  local_80 = (_Base_ptr)&this->params_doubles;
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                  *)local_80);
  local_90 = &this->params_ints;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
          ::size(local_90);
  this_01 = &this->params_strings;
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          ::size(this_01);
  local_98 = (CLOptions *)&this->version_opt;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName((string *)local_b8,
               (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98);
  uVar4 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_b8);
  std::allocator<option>::allocator((allocator<option> *)&local_50);
  std::vector<option,_std::allocator<option>_>::vector
            ((vector<option,_std::allocator<option>_> *)local_b8,
             (long)(int)((uVar4 & 0xff ^ 3) + (int)sVar8 + (int)sVar7 + (int)sVar6 + (int)sVar5),
             (allocator_type *)&local_50);
  pCVar16 = (CLOptions *)local_b8;
  std::vector<option,_std::allocator<option>_>::operator=
            (this_00,(vector<option,_std::allocator<option>_> *)local_b8);
  std::vector<option,_std::allocator<option>_>::~vector
            ((vector<option,_std::allocator<option>_> *)local_b8);
  __gnu_cxx::new_allocator<option>::~new_allocator((new_allocator<option> *)&local_50);
  DefineOptSingle((option *)local_b8,pCVar16,&this->help_str,0,(int *)0x0,'h');
  local_88 = (_Base_ptr)this_00;
  pvVar9 = std::vector<option,_std::allocator<option>_>::operator[](this_00,0);
  pvVar9->name = (char *)local_b8._0_8_;
  *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
  pvVar9->flag = (int *)local_b8._16_8_;
  *(undefined8 *)&pvVar9->val = local_b8._24_8_;
  pCVar16 = local_98;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName((string *)local_b8,
               (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98);
  cVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_b8);
  uVar14 = 1;
  if (cVar2 == '\0') {
    DefineOptSingle((option *)local_b8,pCVar16,&this->version_str,0,(int *)0x0,'v');
    pvVar9 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)local_88,1);
    pvVar9->name = (char *)local_b8._0_8_;
    *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
    pvVar9->flag = (int *)local_b8._16_8_;
    *(undefined8 *)&pvVar9->val = local_b8._24_8_;
    uVar14 = 2;
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator(&local_58);
  p_Var1 = local_78;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                *)local_78);
  local_b8._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
              *)p_Var1);
  pCVar16 = (CLOptions *)local_b8;
  bVar3 = std::operator!=(&local_58,(_Self *)pCVar16);
  p_Var1 = local_88;
  local_98 = (CLOptions *)this_01;
  if (bVar3) {
    __n = uVar14;
    do {
      name = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->(&local_58);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                ::operator->(&local_58);
      cVar2 = CLParam<bool>::getShortParamName((CLParam<bool> *)ppVar10->second);
      DefineOptSingle((option *)local_b8,pCVar16,&name->first,1,(int *)0x0,cVar2);
      uVar14 = __n + 1;
      pvVar9 = std::vector<option,_std::allocator<option>_>::operator[]
                         ((vector<option,_std::allocator<option>_> *)p_Var1,__n);
      pvVar9->name = (char *)local_b8._0_8_;
      *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
      pvVar9->flag = (int *)local_b8._16_8_;
      *(undefined8 *)&pvVar9->val = local_b8._24_8_;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
      ::operator++(&local_58);
      local_b8._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                  *)local_78);
      pCVar16 = (CLOptions *)local_b8;
      bVar3 = std::operator!=(&local_58,(_Self *)local_b8);
      __n = uVar14;
    } while (bVar3);
  }
  p_Var1 = local_80;
  this_03 = local_90;
  this_02 = local_98;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&local_60);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                *)p_Var1);
  local_b8._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
              *)p_Var1);
  pCVar16 = (CLOptions *)local_b8;
  bVar3 = std::operator!=(&local_60,(_Self *)pCVar16);
  p_Var1 = local_88;
  if (bVar3) {
    uVar15 = uVar14 & 0xffffffff;
    do {
      name_00 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                ::operator->(&local_60);
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                ::operator->(&local_60);
      cVar2 = CLParam<double>::getShortParamName(&ppVar11->second->super_CLParam<double>);
      DefineOptSingle((option *)local_b8,pCVar16,&name_00->first,1,(int *)0x0,cVar2);
      uVar14 = uVar15 + 1;
      pvVar9 = std::vector<option,_std::allocator<option>_>::operator[]
                         ((vector<option,_std::allocator<option>_> *)p_Var1,uVar15);
      pvVar9->name = (char *)local_b8._0_8_;
      *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
      pvVar9->flag = (int *)local_b8._16_8_;
      *(undefined8 *)&pvVar9->val = local_b8._24_8_;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
      ::operator++(&local_60);
      local_b8._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                  *)local_80);
      pCVar16 = (CLOptions *)local_b8;
      bVar3 = std::operator!=(&local_60,(_Self *)local_b8);
      uVar15 = uVar14;
      this_02 = local_98;
      this_03 = local_90;
    } while (bVar3);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&local_68);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
       ::begin(this_03);
  local_b8._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
       ::end(this_03);
  pCVar16 = (CLOptions *)local_b8;
  bVar3 = std::operator!=(&local_68,(_Self *)pCVar16);
  if (bVar3) {
    uVar15 = uVar14 & 0xffffffff;
    do {
      name_01 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                ::operator->(&local_68);
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                ::operator->(&local_68);
      cVar2 = CLParam<int>::getShortParamName((CLParam<int> *)ppVar12->second);
      DefineOptSingle((option *)local_b8,pCVar16,&name_01->first,1,(int *)0x0,cVar2);
      uVar14 = uVar15 + 1;
      pvVar9 = std::vector<option,_std::allocator<option>_>::operator[]
                         ((vector<option,_std::allocator<option>_> *)p_Var1,uVar15);
      pvVar9->name = (char *)local_b8._0_8_;
      *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
      pvVar9->flag = (int *)local_b8._16_8_;
      *(undefined8 *)&pvVar9->val = local_b8._24_8_;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
      ::operator++(&local_68);
      local_b8._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
           ::end(local_90);
      pCVar16 = (CLOptions *)local_b8;
      bVar3 = std::operator!=(&local_68,(_Self *)local_b8);
      uVar15 = uVar14;
      this_02 = local_98;
    } while (bVar3);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&local_70);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                *)this_02);
  local_b8._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
              *)this_02);
  pCVar16 = (CLOptions *)local_b8;
  bVar3 = std::operator!=(&local_70,(_Self *)pCVar16);
  if (bVar3) {
    uVar14 = uVar14 & 0xffffffff;
    do {
      name_02 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                ::operator->(&local_70);
      ppVar13 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                ::operator->(&local_70);
      cVar2 = CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::getShortParamName(&ppVar13->second->
                                   super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 );
      DefineOptSingle((option *)local_b8,pCVar16,&name_02->first,1,(int *)0x0,cVar2);
      pvVar9 = std::vector<option,_std::allocator<option>_>::operator[]
                         ((vector<option,_std::allocator<option>_> *)p_Var1,uVar14);
      pvVar9->name = (char *)local_b8._0_8_;
      *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
      pvVar9->flag = (int *)local_b8._16_8_;
      *(undefined8 *)&pvVar9->val = local_b8._24_8_;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
      ::operator++(&local_70);
      local_b8._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                  *)local_98);
      pCVar16 = (CLOptions *)local_b8;
      bVar3 = std::operator!=(&local_70,(_Self *)local_b8);
      uVar14 = uVar14 + 1;
    } while (bVar3);
  }
  std::allocator<char>::allocator();
  pCVar16 = (CLOptions *)0x151726;
  std::__cxx11::string::string((string *)&local_50,"",&local_b9);
  DefineOptSingle((option *)local_b8,pCVar16,&local_50,0,(int *)0x0,'\0');
  pvVar9 = std::vector<option,_std::allocator<option>_>::back
                     ((vector<option,_std::allocator<option>_> *)p_Var1);
  pvVar9->name = (char *)local_b8._0_8_;
  *(undefined8 *)&pvVar9->has_arg = local_b8._8_8_;
  pvVar9->flag = (int *)local_b8._16_8_;
  *(undefined8 *)&pvVar9->val = local_b8._24_8_;
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_b9);
  return;
}

Assistant:

void CLOptions::DefineParams()
{
    // Clear out the longopts object
    longopts.clear() ;
    
    // Resize it to hold exactly the number of variables we need
    int options_count = params_bools.size() +
                        params_doubles.size() +
                        params_ints.size() +
                        params_strings.size() + 2 ;
    if (!version_opt.getParamName().empty()) options_count++ ;
    
    longopts = std::vector<struct option>(options_count) ;
    int opt_num(0) ;
    
    // Add the help option
    longopts[opt_num++] = DefineOptSingle(help_str, no_argument, 0, 'h') ;
    
    // Add the version information if so requested
    if (!version_opt.getParamName().empty()) {
        longopts[opt_num++] = DefineOptSingle(version_str, no_argument, 0, 'v') ;
    }
    
    // Add the bool options
    std::map<std::string, CLBool*>::iterator biter ;
    for (biter=params_bools.begin(); biter!=params_bools.end(); ++biter) {
        longopts[opt_num++] = DefineOptSingle(biter->first, required_argument, 0,
                                              biter->second->getShortParamName()) ;
    }
    
    // Add the double options
    std::map<std::string, CLDouble*>::iterator diter ;
    for (diter=params_doubles.begin(); diter!=params_doubles.end(); ++diter) {
        longopts[opt_num++] = DefineOptSingle(diter->first, required_argument, 0, 
                                              diter->second->getShortParamName()) ;
    }
    
    // Add the int options
    std::map<std::string, CLInt*>::iterator iiter ;
    for (iiter=params_ints.begin(); iiter!=params_ints.end(); ++iiter) {
        longopts[opt_num++] = DefineOptSingle(iiter->first, required_argument, 0, 
                                              iiter->second->getShortParamName()) ;
    }
    
    // Add the string options
    std::map<std::string, CLString*>::iterator siter ;
    for (siter=params_strings.begin(); siter!=params_strings.end(); ++siter) {
        longopts[opt_num++] = DefineOptSingle(siter->first, required_argument, 0, 
                                              siter->second->getShortParamName()) ;
    }
    
    // Add the terminating options
    longopts.back() = DefineOptSingle("",0,0,0) ;
}